

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::RuleBasedCollator::doCompare
          (RuleBasedCollator *this,uint8_t *left,int32_t leftLength,uint8_t *right,
          int32_t rightLength,UErrorCode *errorCode)

{
  Normalizer2Impl *nfcImpl_00;
  UBool UVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  bool bVar5;
  undefined1 local_c18 [8];
  FCDUTF8NFDIterator rightIter_3;
  FCDUTF8NFDIterator leftIter_3;
  UTF8NFDIterator rightIter_2;
  UTF8NFDIterator leftIter_2;
  Normalizer2Impl *nfcImpl;
  FCDUTF8CollationIterator rightIter_1;
  FCDUTF8CollationIterator leftIter_1;
  undefined1 local_3a0 [8];
  UTF8CollationIterator rightIter;
  UTF8CollationIterator leftIter;
  UCollationResult local_68;
  int32_t fastLatinOptions;
  int32_t result;
  UChar32 c_3;
  int iStack_58;
  uint8_t __t_1;
  UChar32 c_2;
  int32_t i_1;
  int iStack_4c;
  uint8_t __t;
  UChar32 c_1;
  int32_t i;
  UBool unsafe;
  UBool numeric;
  uint8_t c;
  UErrorCode *pUStack_40;
  int32_t equalPrefixLength;
  UErrorCode *errorCode_local;
  uint8_t *puStack_30;
  int32_t rightLength_local;
  uint8_t *right_local;
  uint8_t *puStack_20;
  int32_t leftLength_local;
  uint8_t *left_local;
  RuleBasedCollator *this_local;
  
  if ((left == right) && (leftLength == rightLength)) {
    return UCOL_EQUAL;
  }
  i = 0;
  if (leftLength < 0) {
    for (; left[i] == right[i]; i = i + 1) {
      if (left[i] == '\0') {
        return UCOL_EQUAL;
      }
    }
  }
  else {
    for (; i != leftLength; i = i + 1) {
      if ((i == rightLength) || (left[i] != right[i])) goto LAB_00274a02;
    }
    if (i == rightLength) {
      return UCOL_EQUAL;
    }
  }
LAB_00274a02:
  if ((0 < i) &&
     (((i != leftLength && ((char)left[i] < -0x40)) ||
      ((i != rightLength && ((char)right[i] < -0x40)))))) {
    do {
      i = i + -1;
      bVar5 = false;
      if (0 < i) {
        bVar5 = (char)left[i] < -0x40;
      }
    } while (bVar5);
  }
  pUStack_40 = errorCode;
  errorCode_local._4_4_ = rightLength;
  puStack_30 = right;
  right_local._4_4_ = leftLength;
  puStack_20 = left;
  left_local = (uint8_t *)this;
  UVar1 = CollationSettings::isNumeric(this->settings);
  if (i < 1) goto LAB_00274eee;
  c_1._1_1_ = '\0';
  if (i != right_local._4_4_) {
    iStack_4c = i + 1;
    i_1 = (int32_t)puStack_20[i];
    if ((puStack_20[i] & 0x80) != 0) {
      if (iStack_4c != right_local._4_4_) {
        if ((uint)i_1 < 0xe0) {
          if (0xc1 < (uint)i_1) {
            i_1 = i_1 & 0x1f;
LAB_00274c1b:
            if ((byte)(puStack_20[iStack_4c] + 0x80) < 0x40) {
              i_1 = i_1 << 6 | (uint)(byte)(puStack_20[iStack_4c] + 0x80);
              goto LAB_00274c62;
            }
          }
        }
        else if ((uint)i_1 < 0xf0) {
          i_1 = i_1 & 0xf;
          if (((int)" 000000000000\x1000"[i_1] & 1 << (sbyte)((int)(uint)puStack_20[iStack_4c] >> 5)
              ) != 0) {
            c_2._3_1_ = puStack_20[iStack_4c] & 0x3f;
LAB_00274be2:
            i_1 = i_1 << 6 | (uint)c_2._3_1_;
            iStack_4c = iStack_4c + 1;
            if (iStack_4c != right_local._4_4_) goto LAB_00274c1b;
          }
        }
        else {
          iVar3 = i_1 - 0xf0;
          if ((iVar3 < 5) &&
             (((int)""[(int)(uint)puStack_20[iStack_4c] >> 4] & 1 << ((byte)iVar3 & 0x1f)) != 0)) {
            i_1 = iVar3 * 0x40 | puStack_20[iStack_4c] & 0x3f;
            iStack_4c = i + 2;
            if ((iStack_4c != right_local._4_4_) &&
               (c_2._3_1_ = puStack_20[iStack_4c] + 0x80, c_2._3_1_ < 0x40)) goto LAB_00274be2;
          }
        }
      }
      i_1 = 0xfffd;
    }
LAB_00274c62:
    c_1._1_1_ = CollationData::isUnsafeBackward(this->data,i_1,UVar1);
  }
  if ((c_1._1_1_ == '\0') && (i != errorCode_local._4_4_)) {
    iStack_58 = i + 1;
    c_3 = (UChar32)puStack_30[i];
    if ((puStack_30[i] & 0x80) != 0) {
      if (iStack_58 != errorCode_local._4_4_) {
        if ((uint)c_3 < 0xe0) {
          if (0xc1 < (uint)c_3) {
            c_3 = c_3 & 0x1f;
LAB_00274e06:
            if ((byte)(puStack_30[iStack_58] + 0x80) < 0x40) {
              c_3 = c_3 << 6 | (uint)(byte)(puStack_30[iStack_58] + 0x80);
              goto LAB_00274e4d;
            }
          }
        }
        else if ((uint)c_3 < 0xf0) {
          c_3 = c_3 & 0xf;
          if (((int)" 000000000000\x1000"[c_3] & 1 << (sbyte)((int)(uint)puStack_30[iStack_58] >> 5)
              ) != 0) {
            result._3_1_ = puStack_30[iStack_58] & 0x3f;
LAB_00274dcd:
            c_3 = c_3 << 6 | (uint)result._3_1_;
            iStack_58 = iStack_58 + 1;
            if (iStack_58 != errorCode_local._4_4_) goto LAB_00274e06;
          }
        }
        else {
          iVar3 = c_3 - 0xf0;
          if ((iVar3 < 5) &&
             (((int)""[(int)(uint)puStack_30[iStack_58] >> 4] & 1 << ((byte)iVar3 & 0x1f)) != 0)) {
            c_3 = iVar3 * 0x40 | puStack_30[iStack_58] & 0x3f;
            iStack_58 = i + 2;
            if ((iStack_58 != errorCode_local._4_4_) &&
               (result._3_1_ = puStack_30[iStack_58] + 0x80, result._3_1_ < 0x40))
            goto LAB_00274dcd;
          }
        }
      }
      c_3 = 0xfffd;
    }
LAB_00274e4d:
    c_1._1_1_ = CollationData::isUnsafeBackward(this->data,c_3,UVar1);
  }
  if (c_1._1_1_ != '\0') {
    do {
      i = i + -1;
      fastLatinOptions = (int32_t)puStack_20[i];
      if ((puStack_20[i] & 0x80) != 0) {
        fastLatinOptions = utf8_prevCharSafeBody_63(puStack_20,0,&i,fastLatinOptions,-3);
      }
      bVar5 = false;
      if (0 < i) {
        UVar2 = CollationData::isUnsafeBackward(this->data,fastLatinOptions,UVar1);
        bVar5 = UVar2 != '\0';
      }
    } while (bVar5);
  }
LAB_00274eee:
  iVar3 = this->settings->fastLatinOptions;
  if (((iVar3 < 0) || ((i != right_local._4_4_ && (0xc5 < puStack_20[i])))) ||
     ((i != errorCode_local._4_4_ && (0xc5 < puStack_30[i])))) {
    local_68 = ~UCOL_GREATER;
  }
  else if (right_local._4_4_ < 0) {
    local_68 = CollationFastLatin::compareUTF8
                         (this->data->fastLatinTable,this->settings->fastLatinPrimaries,iVar3,
                          puStack_20 + i,-1,puStack_30 + i,-1);
  }
  else {
    local_68 = CollationFastLatin::compareUTF8
                         (this->data->fastLatinTable,this->settings->fastLatinPrimaries,iVar3,
                          puStack_20 + i,right_local._4_4_ - i,puStack_30 + i,
                          errorCode_local._4_4_ - i);
  }
  if (local_68 == ~UCOL_GREATER) {
    UVar2 = CollationSettings::dontCheckFCD(this->settings);
    if (UVar2 == '\0') {
      FCDUTF8CollationIterator::FCDUTF8CollationIterator
                ((FCDUTF8CollationIterator *)((long)&rightIter_1.normalized.fUnion + 0x30),
                 this->data,UVar1,puStack_20,i,right_local._4_4_);
      FCDUTF8CollationIterator::FCDUTF8CollationIterator
                ((FCDUTF8CollationIterator *)&nfcImpl,this->data,UVar1,puStack_30,i,
                 errorCode_local._4_4_);
      local_68 = CollationCompare::compareUpToQuaternary
                           ((CollationIterator *)((long)&rightIter_1.normalized.fUnion + 0x30),
                            (CollationIterator *)&nfcImpl,this->settings,pUStack_40);
      FCDUTF8CollationIterator::~FCDUTF8CollationIterator((FCDUTF8CollationIterator *)&nfcImpl);
      FCDUTF8CollationIterator::~FCDUTF8CollationIterator
                ((FCDUTF8CollationIterator *)((long)&rightIter_1.normalized.fUnion + 0x30));
    }
    else {
      UTF8CollationIterator::UTF8CollationIterator
                ((UTF8CollationIterator *)&rightIter.pos,this->data,UVar1,puStack_20,i,
                 right_local._4_4_);
      UTF8CollationIterator::UTF8CollationIterator
                ((UTF8CollationIterator *)local_3a0,this->data,UVar1,puStack_30,i,
                 errorCode_local._4_4_);
      local_68 = CollationCompare::compareUpToQuaternary
                           ((CollationIterator *)&rightIter.pos,(CollationIterator *)local_3a0,
                            this->settings,pUStack_40);
      UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)local_3a0);
      UTF8CollationIterator::~UTF8CollationIterator((UTF8CollationIterator *)&rightIter.pos);
    }
  }
  if (((local_68 == UCOL_EQUAL) &&
      (iVar4 = CollationSettings::getStrength(this->settings), 0xe < iVar4)) &&
     (UVar1 = ::U_FAILURE(*pUStack_40), UVar1 == '\0')) {
    nfcImpl_00 = this->data->nfcImpl;
    puStack_20 = puStack_20 + i;
    puStack_30 = puStack_30 + i;
    if (0 < right_local._4_4_) {
      right_local._4_4_ = right_local._4_4_ - i;
      errorCode_local._4_4_ = errorCode_local._4_4_ - i;
    }
    UVar1 = CollationSettings::dontCheckFCD(this->settings);
    if (UVar1 == '\0') {
      anon_unknown_16::FCDUTF8NFDIterator::FCDUTF8NFDIterator
                ((FCDUTF8NFDIterator *)((long)&rightIter_3.u8ci.normalized.fUnion + 0x30),this->data
                 ,puStack_20,right_local._4_4_);
      anon_unknown_16::FCDUTF8NFDIterator::FCDUTF8NFDIterator
                ((FCDUTF8NFDIterator *)local_c18,this->data,puStack_30,errorCode_local._4_4_);
      this_local._4_4_ =
           anon_unknown_16::compareNFDIter
                     (nfcImpl_00,(NFDIterator *)((long)&rightIter_3.u8ci.normalized.fUnion + 0x30),
                      (NFDIterator *)local_c18);
      anon_unknown_16::FCDUTF8NFDIterator::~FCDUTF8NFDIterator((FCDUTF8NFDIterator *)local_c18);
      anon_unknown_16::FCDUTF8NFDIterator::~FCDUTF8NFDIterator
                ((FCDUTF8NFDIterator *)((long)&rightIter_3.u8ci.normalized.fUnion + 0x30));
    }
    else {
      anon_unknown_16::UTF8NFDIterator::UTF8NFDIterator
                ((UTF8NFDIterator *)&rightIter_2.pos,puStack_20,right_local._4_4_);
      anon_unknown_16::UTF8NFDIterator::UTF8NFDIterator
                ((UTF8NFDIterator *)((long)&leftIter_3.u8ci.normalized.fUnion + 0x30),puStack_30,
                 errorCode_local._4_4_);
      this_local._4_4_ =
           anon_unknown_16::compareNFDIter
                     (nfcImpl_00,(NFDIterator *)&rightIter_2.pos,
                      (NFDIterator *)((long)&leftIter_3.u8ci.normalized.fUnion + 0x30));
      anon_unknown_16::UTF8NFDIterator::~UTF8NFDIterator
                ((UTF8NFDIterator *)((long)&leftIter_3.u8ci.normalized.fUnion + 0x30));
      anon_unknown_16::UTF8NFDIterator::~UTF8NFDIterator((UTF8NFDIterator *)&rightIter_2.pos);
    }
  }
  else {
    this_local._4_4_ = local_68;
  }
  return this_local._4_4_;
}

Assistant:

UCollationResult
RuleBasedCollator::doCompare(const uint8_t *left, int32_t leftLength,
                             const uint8_t *right, int32_t rightLength,
                             UErrorCode &errorCode) const {
    // U_FAILURE(errorCode) checked by caller.
    if(left == right && leftLength == rightLength) {
        return UCOL_EQUAL;
    }

    // Identical-prefix test.
    int32_t equalPrefixLength = 0;
    if(leftLength < 0) {
        uint8_t c;
        while((c = left[equalPrefixLength]) == right[equalPrefixLength]) {
            if(c == 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }
    } else {
        for(;;) {
            if(equalPrefixLength == leftLength) {
                if(equalPrefixLength == rightLength) { return UCOL_EQUAL; }
                break;
            } else if(equalPrefixLength == rightLength ||
                      left[equalPrefixLength] != right[equalPrefixLength]) {
                break;
            }
            ++equalPrefixLength;
        }
    }
    // Back up to the start of a partially-equal code point.
    if(equalPrefixLength > 0 &&
            ((equalPrefixLength != leftLength && U8_IS_TRAIL(left[equalPrefixLength])) ||
            (equalPrefixLength != rightLength && U8_IS_TRAIL(right[equalPrefixLength])))) {
        while(--equalPrefixLength > 0 && U8_IS_TRAIL(left[equalPrefixLength])) {}
    }

    UBool numeric = settings->isNumeric();
    if(equalPrefixLength > 0) {
        UBool unsafe = FALSE;
        if(equalPrefixLength != leftLength) {
            int32_t i = equalPrefixLength;
            UChar32 c;
            U8_NEXT_OR_FFFD(left, i, leftLength, c);
            unsafe = data->isUnsafeBackward(c, numeric);
        }
        if(!unsafe && equalPrefixLength != rightLength) {
            int32_t i = equalPrefixLength;
            UChar32 c;
            U8_NEXT_OR_FFFD(right, i, rightLength, c);
            unsafe = data->isUnsafeBackward(c, numeric);
        }
        if(unsafe) {
            // Identical prefix: Back up to the start of a contraction or reordering sequence.
            UChar32 c;
            do {
                U8_PREV_OR_FFFD(left, 0, equalPrefixLength, c);
            } while(equalPrefixLength > 0 && data->isUnsafeBackward(c, numeric));
        }
        // See the notes in the UTF-16 version.

        // Pass the actual start of each string into the CollationIterators,
        // plus the equalPrefixLength position,
        // so that prefix matches back into the equal prefix work.
    }

    int32_t result;
    int32_t fastLatinOptions = settings->fastLatinOptions;
    if(fastLatinOptions >= 0 &&
            (equalPrefixLength == leftLength ||
                left[equalPrefixLength] <= CollationFastLatin::LATIN_MAX_UTF8_LEAD) &&
            (equalPrefixLength == rightLength ||
                right[equalPrefixLength] <= CollationFastLatin::LATIN_MAX_UTF8_LEAD)) {
        if(leftLength >= 0) {
            result = CollationFastLatin::compareUTF8(data->fastLatinTable,
                                                     settings->fastLatinPrimaries,
                                                     fastLatinOptions,
                                                     left + equalPrefixLength,
                                                     leftLength - equalPrefixLength,
                                                     right + equalPrefixLength,
                                                     rightLength - equalPrefixLength);
        } else {
            result = CollationFastLatin::compareUTF8(data->fastLatinTable,
                                                     settings->fastLatinPrimaries,
                                                     fastLatinOptions,
                                                     left + equalPrefixLength, -1,
                                                     right + equalPrefixLength, -1);
        }
    } else {
        result = CollationFastLatin::BAIL_OUT_RESULT;
    }

    if(result == CollationFastLatin::BAIL_OUT_RESULT) {
        if(settings->dontCheckFCD()) {
            UTF8CollationIterator leftIter(data, numeric, left, equalPrefixLength, leftLength);
            UTF8CollationIterator rightIter(data, numeric, right, equalPrefixLength, rightLength);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        } else {
            FCDUTF8CollationIterator leftIter(data, numeric, left, equalPrefixLength, leftLength);
            FCDUTF8CollationIterator rightIter(data, numeric, right, equalPrefixLength, rightLength);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        }
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return (UCollationResult)result;
    }

    // Note: If NUL-terminated, we could get the actual limits from the iterators now.
    // That would complicate the iterators a bit, NUL-terminated strings are only a C convenience,
    // and the benefit seems unlikely to be measurable.

    // Compare identical level.
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    left += equalPrefixLength;
    right += equalPrefixLength;
    if(leftLength > 0) {
        leftLength -= equalPrefixLength;
        rightLength -= equalPrefixLength;
    }
    if(settings->dontCheckFCD()) {
        UTF8NFDIterator leftIter(left, leftLength);
        UTF8NFDIterator rightIter(right, rightLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUTF8NFDIterator leftIter(data, left, leftLength);
        FCDUTF8NFDIterator rightIter(data, right, rightLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}